

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ColumnsFromExprList(Parse *pParse,ExprList *pEList,i16 *pnCol,Column **paCol)

{
  uint uVar1;
  void *pvVar2;
  Column *pCVar3;
  bool bVar4;
  char *local_b0;
  Table *pTab;
  Expr *pEStack_90;
  int iCol;
  Expr *pColExpr;
  Hash ht;
  char *pcStack_68;
  int nName;
  char *zName;
  Column *pCStack_58;
  int nCol;
  Column *pCol;
  Column *aCol;
  uint local_40;
  u32 cnt;
  int j;
  int i;
  sqlite3 *db;
  Column **paCol_local;
  i16 *pnCol_local;
  ExprList *pEList_local;
  Parse *pParse_local;
  
  _j = pParse->db;
  db = (sqlite3 *)paCol;
  paCol_local = (Column **)pnCol;
  pnCol_local = (i16 *)pEList;
  pEList_local = (ExprList *)pParse;
  sqlite3HashInit((Hash *)&pColExpr);
  if (pnCol_local == (i16 *)0x0) {
    zName._4_4_ = 0;
    pCol = (Column *)0x0;
  }
  else {
    zName._4_4_ = *(int *)pnCol_local;
    pCol = (Column *)sqlite3DbMallocZero(_j,(long)zName._4_4_ << 5);
  }
  *(short *)paCol_local = (short)zName._4_4_;
  db->pVfs = (sqlite3_vfs *)pCol;
  cnt = 0;
  pCStack_58 = pCol;
  while( true ) {
    bVar4 = false;
    if ((int)cnt < zName._4_4_) {
      bVar4 = _j->mallocFailed == '\0';
    }
    if (!bVar4) break;
    pcStack_68 = *(char **)(pnCol_local + (long)(int)cnt * 0x10 + 8);
    if (pcStack_68 == (char *)0x0) {
      for (pEStack_90 = sqlite3ExprSkipCollate(*(Expr **)(pnCol_local + (long)(int)cnt * 0x10 + 4));
          pEStack_90->op == 'z'; pEStack_90 = pEStack_90->pRight) {
      }
      if ((pEStack_90->op == 0x98) && (pEStack_90->pTab != (Table *)0x0)) {
        pTab._4_4_ = (int)pEStack_90->iColumn;
        if (pTab._4_4_ < 0) {
          pTab._4_4_ = (int)pEStack_90->pTab->iPKey;
        }
        if (pTab._4_4_ < 0) {
          local_b0 = "rowid";
        }
        else {
          local_b0 = pEStack_90->pTab->aCol[pTab._4_4_].zName;
        }
        pcStack_68 = local_b0;
      }
      else if (pEStack_90->op == '\x1b') {
        pcStack_68 = (pEStack_90->u).zToken;
      }
      else {
        pcStack_68 = *(char **)(pnCol_local + (long)(int)cnt * 0x10 + 0xc);
      }
    }
    if (pcStack_68 == (char *)0x0) {
      pcStack_68 = sqlite3MPrintf(_j,"column%d",(ulong)(cnt + 1));
    }
    else {
      pcStack_68 = sqlite3DbStrDup(_j,pcStack_68);
    }
    aCol._4_4_ = 0;
    while( true ) {
      bVar4 = false;
      if (pcStack_68 != (char *)0x0) {
        pvVar2 = sqlite3HashFind((Hash *)&pColExpr,pcStack_68);
        bVar4 = pvVar2 != (void *)0x0;
      }
      if (!bVar4) break;
      ht.ht._4_4_ = sqlite3Strlen30(pcStack_68);
      uVar1 = ht.ht._4_4_;
      if (0 < (int)ht.ht._4_4_) {
        do {
          local_40 = uVar1 - 1;
          bVar4 = false;
          if (0 < (int)local_40) {
            bVar4 = (""[(byte)pcStack_68[(int)local_40]] & 4) != 0;
          }
          uVar1 = local_40;
        } while (bVar4);
        if (pcStack_68[(int)local_40] == ':') {
          ht.ht._4_4_ = local_40;
        }
      }
      aCol._4_4_ = aCol._4_4_ + 1;
      pcStack_68 = sqlite3MPrintf(_j,"%.*z:%u",(ulong)ht.ht._4_4_,pcStack_68);
      if (3 < aCol._4_4_) {
        sqlite3_randomness(4,(void *)((long)&aCol + 4));
      }
    }
    pCStack_58->zName = pcStack_68;
    if ((pcStack_68 != (char *)0x0) &&
       (pCVar3 = (Column *)sqlite3HashInsert((Hash *)&pColExpr,pcStack_68,pCStack_58),
       pCVar3 == pCStack_58)) {
      sqlite3OomFault(_j);
    }
    cnt = cnt + 1;
    pCStack_58 = pCStack_58 + 1;
  }
  sqlite3HashClear((Hash *)&pColExpr);
  if (_j->mallocFailed == '\0') {
    pParse_local._4_4_ = 0;
  }
  else {
    for (local_40 = 0; (int)local_40 < (int)cnt; local_40 = local_40 + 1) {
      sqlite3DbFree(_j,pCol[(int)local_40].zName);
    }
    sqlite3DbFree(_j,pCol);
    db->pVfs = (sqlite3_vfs *)0x0;
    *(undefined2 *)paCol_local = 0;
    pParse_local._4_4_ = 7;
  }
  return pParse_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3ColumnsFromExprList(
  Parse *pParse,          /* Parsing context */
  ExprList *pEList,       /* Expr list from which to derive column names */
  i16 *pnCol,             /* Write the number of columns here */
  Column **paCol          /* Write the new column list here */
){
  sqlite3 *db = pParse->db;   /* Database connection */
  int i, j;                   /* Loop counters */
  u32 cnt;                    /* Index added to make the name unique */
  Column *aCol, *pCol;        /* For looping over result columns */
  int nCol;                   /* Number of columns in the result set */
  char *zName;                /* Column name */
  int nName;                  /* Size of name in zName[] */
  Hash ht;                    /* Hash table of column names */

  sqlite3HashInit(&ht);
  if( pEList ){
    nCol = pEList->nExpr;
    aCol = sqlite3DbMallocZero(db, sizeof(aCol[0])*nCol);
    testcase( aCol==0 );
  }else{
    nCol = 0;
    aCol = 0;
  }
  assert( nCol==(i16)nCol );
  *pnCol = nCol;
  *paCol = aCol;

  for(i=0, pCol=aCol; i<nCol && !db->mallocFailed; i++, pCol++){
    /* Get an appropriate name for the column
    */
    if( (zName = pEList->a[i].zName)!=0 ){
      /* If the column contains an "AS <name>" phrase, use <name> as the name */
    }else{
      Expr *pColExpr = sqlite3ExprSkipCollate(pEList->a[i].pExpr);
      while( pColExpr->op==TK_DOT ){
        pColExpr = pColExpr->pRight;
        assert( pColExpr!=0 );
      }
      if( pColExpr->op==TK_COLUMN && pColExpr->pTab!=0 ){
        /* For columns use the column name name */
        int iCol = pColExpr->iColumn;
        Table *pTab = pColExpr->pTab;
        if( iCol<0 ) iCol = pTab->iPKey;
        zName = iCol>=0 ? pTab->aCol[iCol].zName : "rowid";
      }else if( pColExpr->op==TK_ID ){
        assert( !ExprHasProperty(pColExpr, EP_IntValue) );
        zName = pColExpr->u.zToken;
      }else{
        /* Use the original text of the column expression as its name */
        zName = pEList->a[i].zSpan;
      }
    }
    if( zName ){
      zName = sqlite3DbStrDup(db, zName);
    }else{
      zName = sqlite3MPrintf(db,"column%d",i+1);
    }

    /* Make sure the column name is unique.  If the name is not unique,
    ** append an integer to the name so that it becomes unique.
    */
    cnt = 0;
    while( zName && sqlite3HashFind(&ht, zName)!=0 ){
      nName = sqlite3Strlen30(zName);
      if( nName>0 ){
        for(j=nName-1; j>0 && sqlite3Isdigit(zName[j]); j--){}
        if( zName[j]==':' ) nName = j;
      }
      zName = sqlite3MPrintf(db, "%.*z:%u", nName, zName, ++cnt);
      if( cnt>3 ) sqlite3_randomness(sizeof(cnt), &cnt);
    }
    pCol->zName = zName;
    sqlite3ColumnPropertiesFromName(0, pCol);
    if( zName && sqlite3HashInsert(&ht, zName, pCol)==pCol ){
      sqlite3OomFault(db);
    }
  }
  sqlite3HashClear(&ht);
  if( db->mallocFailed ){
    for(j=0; j<i; j++){
      sqlite3DbFree(db, aCol[j].zName);
    }
    sqlite3DbFree(db, aCol);
    *paCol = 0;
    *pnCol = 0;
    return SQLITE_NOMEM_BKPT;
  }
  return SQLITE_OK;
}